

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.h
# Opt level: O3

void __thiscall
ZXing::Pdf417::BarcodeRow::getScaledRow
          (BarcodeRow *this,int scale,vector<bool,_std::allocator<bool>_> *output)

{
  _Bit_type *p_Var1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  std::vector<bool,_std::allocator<bool>_>::resize
            (output,((ulong)(this->_row).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                    ((long)(this->_row).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)(this->_row).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) *
                    (long)scale,false);
  p_Var1 = (output->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  uVar7 = ((long)(output->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) *
          8 + (ulong)(output->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (uVar7 != 0) {
    lVar2 = (long)(this->_row).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar4 = 0;
    do {
      uVar3 = uVar4 / (ulong)(long)scale;
      uVar5 = uVar3 + 0x3f;
      if (-1 < (long)uVar3) {
        uVar5 = uVar3;
      }
      uVar6 = uVar4 + 0x3f;
      if (-1 < (long)uVar4) {
        uVar6 = uVar4;
      }
      lVar9 = (long)uVar6 >> 6;
      uVar8 = (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001);
      uVar6 = 1L << ((byte)uVar4 & 0x3f);
      if ((*(ulong *)(lVar2 + ((long)uVar5 >> 6) * 8 + -8 +
                     (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
           (uVar3 & 0x3f) & 1) == 0) {
        uVar6 = ~uVar6 & p_Var1[lVar9 + uVar8 + 0xffffffffffffffff];
      }
      else {
        uVar6 = uVar6 | p_Var1[lVar9 + uVar8 + 0xffffffffffffffff];
      }
      p_Var1[lVar9 + uVar8 + 0xffffffffffffffff] = uVar6;
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar7);
  }
  return;
}

Assistant:

void getScaledRow(int scale, std::vector<bool>& output) const {
		output.resize(_row.size() * scale);
		for (size_t i = 0; i < output.size(); ++i) {
			output[i] = _row[i / scale];
		}
	}